

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

value_t * alloc_value(zt_gc_t *gc,value_vtbl_t *vtbl)

{
  value_t *v;
  
  if (vtbl == (value_vtbl_t *)0x0) {
    v = (value_t *)0x0;
  }
  else {
    v = (value_t *)zt_calloc_p(1,vtbl->size);
    v->vtbl = vtbl;
    zt_gc_prepare(gc,v);
    printf("Allocating: %p\n",v);
  }
  return v;
}

Assistant:

static value_t *
alloc_value(zt_gc_t * gc, value_vtbl_t * vtbl) {
    value_t     * value;
    if (vtbl == NULL) {
        return NULL;
    }
    value = zt_callocs(vtbl->size, 1);
    value->vtbl = vtbl;

    zt_gc_prepare(gc, (void *)value); /*  */
    printf("Allocating: %p\n", (void *)value);
    return value;
}